

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

void __thiscall BailOutInfo::RecordStartCallInfo(BailOutInfo *this,uint i,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  
  if (this->startCallCount <= i) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x104,"(i < this->startCallCount)","i < this->startCallCount");
    if (!bVar2) goto LAB_003f6c36;
    *puVar4 = 0;
  }
  if (this->startCallInfo == (StartCallInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x105,"(this->startCallInfo)","this->startCallInfo");
    if (!bVar2) goto LAB_003f6c36;
    *puVar4 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x106,"(instr)","instr");
    if (!bVar2) goto LAB_003f6c36;
    *puVar4 = 0;
  }
  if (instr->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x107,"(instr->m_opcode == Js::OpCode::StartCall)",
                       "instr->m_opcode == Js::OpCode::StartCall");
    if (!bVar2) goto LAB_003f6c36;
    *puVar4 = 0;
  }
  if (instr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x108,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar2) {
LAB_003f6c36:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar3 = IR::Instr::GetArgOutCount(instr,true);
  this->startCallInfo[i] = uVar3;
  return;
}

Assistant:

void
BailOutInfo::RecordStartCallInfo(uint i, IR::Instr *instr)
{
    Assert(i < this->startCallCount);
    Assert(this->startCallInfo);
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::StartCall);
    Assert(instr->GetSrc1());

    this->startCallInfo[i] = instr->GetArgOutCount(/*getInterpreterArgOutCount*/ true);
}